

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  art_val_t *paVar1;
  int iVar2;
  art_val_t *val;
  container_t *pcVar3;
  byte type2;
  art_iterator_t *paVar4;
  bool bVar5;
  bool bVar6;
  uint8_t typecode2;
  art_iterator_t it2;
  art_iterator_t it1;
  art_key_chunk_t local_149 [9];
  art_iterator_t local_140;
  art_iterator_t local_b8;
  
  if (r1 != r2) {
    art_init_iterator(&local_b8,&r1->art,true);
    art_init_iterator(&local_140,&r2->art,true);
    bVar5 = local_b8.value != (art_val_t *)0x0;
    bVar6 = local_140.value != (art_val_t *)0x0;
    if (bVar5 || bVar6) {
      do {
        paVar4 = &local_b8;
        if ((bVar5) && (bVar6)) {
          iVar2 = art_compare_keys(local_b8.key,local_140.key);
          paVar1 = local_b8.value;
          if (iVar2 == 0) {
            type2 = local_140.value[1].key[0];
            if (local_b8.value[1].key[0] != 4) {
              if (type2 == 4) {
                type2 = *(byte *)((long)*(container_t **)(local_140.value[1].key + 2) + 8);
              }
              local_149[1] = '\0';
              local_149[2] = '\0';
              local_149[3] = '\0';
              local_149[4] = '\0';
              local_149[5] = '\0';
              local_149[6] = '\0';
              local_149[7] = '\0';
              local_149[8] = '\0';
              (*(code *)(&DAT_0012d558 +
                        *(int *)(&DAT_0012d558 +
                                (ulong)(((uint)type2 + (uint)local_b8.value[1].key[0] * 4) - 5) * 4)
                        ))();
              return;
            }
            pcVar3 = container_or(*(container_t **)(local_b8.value[1].key + 2),'\x04',
                                  *(container_t **)(local_140.value[1].key + 2),type2,local_149);
            if (pcVar3 != *(container_t **)(paVar1[1].key + 2)) {
              container_free(*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0]);
              *(container_t **)(paVar1[1].key + 2) = pcVar3;
              paVar1[1].key[0] = local_149[0];
            }
            art_iterator_next(&local_b8);
            paVar4 = &local_140;
          }
          else if ((bool)(bVar6 & -1 < iVar2)) {
LAB_00107223:
            paVar1 = local_140.value;
            val = (art_val_t *)roaring_malloc(0x10);
            val[1].key[0] = paVar1[1].key[0];
            pcVar3 = get_copy_of_container(*(container_t **)(paVar1[1].key + 2),val[1].key,false);
            *(container_t **)(val[1].key + 2) = pcVar3;
            art_iterator_insert(&r1->art,&local_b8,local_140.key,val);
            paVar4 = &local_140;
          }
LAB_00107479:
          art_iterator_next(paVar4);
        }
        else if (bVar5) {
          if (!bVar6) goto LAB_00107479;
        }
        else if (bVar6) goto LAB_00107223;
        bVar5 = local_b8.value != (art_val_t *)0x0;
        bVar6 = local_140.value != (art_val_t *)0x0;
      } while (bVar5 || bVar6);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,
                                 const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> it1++
        // 2. !it1_present && it2_present  -> add it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> add it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                uint8_t typecode2;
                container_t *container2;
                if (leaf1->typecode == SHARED_CONTAINER_TYPE) {
                    container2 = container_or(leaf1->container, leaf1->typecode,
                                              leaf2->container, leaf2->typecode,
                                              &typecode2);
                } else {
                    container2 = container_ior(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                }
                if (container2 != leaf1->container) {
                    container_free(leaf1->container, leaf1->typecode);
                    leaf1->container = container2;
                    leaf1->typecode = typecode2;
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it2.value);
            art_iterator_insert(&r1->art, &it1, it2.key,
                                (art_val_t *)result_leaf);
            art_iterator_next(&it2);
        }
    }
}